

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_sse4.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_2d_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  int16_t *piVar1;
  undefined2 *puVar2;
  uint16_t *puVar3;
  undefined2 *puVar4;
  undefined2 *puVar5;
  undefined2 *puVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  char cVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  byte bVar30;
  byte bVar31;
  uint uVar32;
  CONV_BUF_TYPE *pCVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  undefined1 *puVar39;
  int iVar40;
  ulong uVar41;
  int iVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  short sVar51;
  int iVar52;
  short sVar60;
  int iVar61;
  short sVar63;
  int iVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar67;
  undefined1 auVar57 [16];
  short sVar59;
  short sVar62;
  undefined1 auVar58 [16];
  short sVar68;
  int iVar69;
  int iVar84;
  int iVar85;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar86;
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  uint local_8ba8;
  short local_8b78;
  short sStack_8b76;
  undefined1 local_8b38 [1792];
  undefined1 local_8438 [33800];
  undefined1 auVar54 [16];
  undefined1 auVar72 [16];
  undefined1 auVar77 [16];
  undefined1 auVar73 [16];
  undefined1 auVar78 [16];
  undefined1 auVar74 [16];
  undefined1 auVar79 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  
  puVar39 = local_8b38;
  cVar20 = (char)bd + '\x0e';
  uVar8 = conv_params->round_1;
  iVar38 = uVar8 + conv_params->round_0;
  bVar30 = cVar20 - (char)iVar38;
  uVar29 = 0xe - iVar38;
  uVar34 = 0xff;
  if (bd == 0xc) {
    uVar34 = 0xfff;
  }
  uVar32 = 0x3ff;
  if (bd != 10) {
    uVar32 = uVar34;
  }
  bVar31 = (byte)conv_params->round_0;
  uVar7 = filter_params_y->taps;
  uVar34 = (h + (uint)uVar7) - 1;
  if (0 < (int)uVar34) {
    iVar38 = ((1 << (bVar31 & 0x1f)) >> 1) + (1 << ((char)bd + 6U & 0x1f));
    auVar43 = ZEXT416((uint)conv_params->round_0);
    piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
    uVar21 = *(undefined4 *)piVar1;
    uVar22 = *(undefined4 *)(piVar1 + 2);
    uVar23 = *(undefined4 *)(piVar1 + 4);
    uVar24 = *(undefined4 *)(piVar1 + 6);
    auVar46._4_4_ = uVar21;
    auVar46._0_4_ = uVar21;
    auVar46._8_4_ = uVar21;
    auVar46._12_4_ = uVar21;
    auVar44._4_4_ = uVar22;
    auVar44._0_4_ = uVar22;
    auVar44._8_4_ = uVar22;
    auVar44._12_4_ = uVar22;
    in_XMM4._4_4_ = uVar23;
    in_XMM4._0_4_ = uVar23;
    in_XMM4._8_4_ = uVar23;
    in_XMM4._12_4_ = uVar23;
    auVar45._4_4_ = uVar24;
    auVar45._0_4_ = uVar24;
    auVar45._8_4_ = uVar24;
    auVar45._12_4_ = uVar24;
    lVar37 = (long)src +
             (0x12 - ((long)(int)(((uVar7 >> 1) - 1) * src_stride) * 2 +
                     (ulong)(filter_params_x->taps >> 1) * 2));
    uVar41 = 0;
    do {
      if (0 < w) {
        lVar36 = 0;
        do {
          auVar47 = *(undefined1 (*) [16])(lVar37 + -0x10 + lVar36 * 2);
          auVar88 = *(undefined1 (*) [16])(lVar37 + lVar36 * 2);
          auVar13._16_16_ = auVar88;
          auVar13._0_16_ = auVar47;
          auVar14._16_16_ = auVar88;
          auVar14._0_16_ = auVar47;
          auVar49 = pmaddwd(auVar14._8_16_,in_XMM4);
          auVar15._16_16_ = auVar88;
          auVar15._0_16_ = auVar47;
          auVar50 = pmaddwd(auVar15._12_16_,auVar45);
          auVar16._16_16_ = auVar88;
          auVar16._0_16_ = auVar47;
          auVar17._16_16_ = auVar88;
          auVar17._0_16_ = auVar47;
          auVar18._16_16_ = auVar88;
          auVar18._0_16_ = auVar47;
          auVar19._16_16_ = auVar88;
          auVar19._0_16_ = auVar47;
          auVar47 = pmaddwd(auVar47,auVar46);
          auVar48 = pmaddwd(auVar13._4_16_,auVar44);
          auVar88._0_4_ =
               auVar47._0_4_ + iVar38 + auVar48._0_4_ + auVar50._0_4_ + auVar49._0_4_ >> auVar43;
          auVar88._4_4_ =
               auVar47._4_4_ + iVar38 + auVar48._4_4_ + auVar50._4_4_ + auVar49._4_4_ >> auVar43;
          auVar88._8_4_ =
               auVar47._8_4_ + iVar38 + auVar48._8_4_ + auVar50._8_4_ + auVar49._8_4_ >> auVar43;
          auVar88._12_4_ =
               auVar47._12_4_ + iVar38 + auVar48._12_4_ + auVar50._12_4_ + auVar49._12_4_ >> auVar43
          ;
          auVar48 = pmaddwd(auVar16._2_16_,auVar46);
          auVar50 = pmaddwd(auVar17._6_16_,auVar44);
          auVar70 = pmaddwd(auVar18._10_16_,in_XMM4);
          auVar47 = pmaddwd(auVar19._14_16_,auVar45);
          auVar49._0_4_ =
               auVar48._0_4_ + iVar38 + auVar70._0_4_ + auVar50._0_4_ + auVar47._0_4_ >> auVar43;
          auVar49._4_4_ =
               auVar48._4_4_ + iVar38 + auVar70._4_4_ + auVar50._4_4_ + auVar47._4_4_ >> auVar43;
          auVar49._8_4_ =
               auVar48._8_4_ + iVar38 + auVar70._8_4_ + auVar50._8_4_ + auVar47._8_4_ >> auVar43;
          auVar49._12_4_ =
               auVar48._12_4_ + iVar38 + auVar70._12_4_ + auVar50._12_4_ + auVar47._12_4_ >> auVar43
          ;
          auVar47 = packssdw(auVar88,auVar49);
          *(undefined1 (*) [16])(puVar39 + lVar36 * 2) = auVar47;
          lVar36 = lVar36 + 8;
        } while (lVar36 < w);
      }
      uVar41 = uVar41 + 1;
      lVar37 = lVar37 + (long)src_stride * 2;
      puVar39 = puVar39 + 0x100;
    } while (uVar41 != uVar34);
  }
  local_8ba8 = (uint)uVar7;
  if (0 < h) {
    iVar35 = (1 << (bVar30 - 1 & 0x1f)) + (1 << (bVar30 & 0x1f));
    iVar38 = conv_params->fwd_offset;
    iVar9 = conv_params->bck_offset;
    auVar43 = pshuflw(in_XMM4,ZEXT416(uVar32),0);
    pCVar33 = conv_params->dst;
    iVar10 = conv_params->dst_stride;
    iVar11 = conv_params->do_average;
    iVar12 = conv_params->use_dist_wtd_comp_avg;
    iVar40 = ((1 << ((byte)uVar8 & 0x1f)) >> 1) + (-1 << (cVar20 + ~bVar31 & 0x1f));
    auVar46 = ZEXT416(uVar8);
    piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * local_8ba8;
    uVar21 = *(undefined4 *)piVar1;
    uVar22 = *(undefined4 *)(piVar1 + 2);
    uVar23 = *(undefined4 *)(piVar1 + 4);
    uVar24 = *(undefined4 *)(piVar1 + 6);
    auVar47._4_4_ = uVar21;
    auVar47._0_4_ = uVar21;
    auVar47._8_4_ = uVar21;
    auVar47._12_4_ = uVar21;
    auVar48._4_4_ = uVar22;
    auVar48._0_4_ = uVar22;
    auVar48._8_4_ = uVar22;
    auVar48._12_4_ = uVar22;
    auVar50._4_4_ = uVar23;
    auVar50._0_4_ = uVar23;
    auVar50._8_4_ = uVar23;
    auVar50._12_4_ = uVar23;
    auVar70._4_4_ = uVar24;
    auVar70._0_4_ = uVar24;
    auVar70._8_4_ = uVar24;
    auVar70._12_4_ = uVar24;
    iVar42 = ((1 << ((byte)uVar29 & 0x1f)) >> 1) - iVar35;
    puVar39 = local_8438;
    uVar41 = 0;
    do {
      if (0 < w) {
        lVar37 = 0;
        do {
          auVar44 = *(undefined1 (*) [16])(puVar39 + lVar37 * 2 + -0x700);
          puVar4 = (undefined2 *)(puVar39 + lVar37 * 2 + -0x600);
          auVar45 = *(undefined1 (*) [16])(puVar39 + lVar37 * 2 + -0x500);
          auVar74._0_12_ = auVar44._0_12_;
          auVar74._12_2_ = auVar44._6_2_;
          auVar74._14_2_ = puVar4[3];
          auVar73._12_4_ = auVar74._12_4_;
          auVar73._0_10_ = auVar44._0_10_;
          auVar73._10_2_ = puVar4[2];
          auVar72._10_6_ = auVar73._10_6_;
          auVar72._0_8_ = auVar44._0_8_;
          auVar72._8_2_ = auVar44._4_2_;
          auVar71._8_8_ = auVar72._8_8_;
          auVar71._6_2_ = puVar4[1];
          auVar71._4_2_ = auVar44._2_2_;
          auVar71._0_2_ = auVar44._0_2_;
          auVar71._2_2_ = *puVar4;
          puVar5 = (undefined2 *)(puVar39 + lVar37 * 2 + -0x400);
          auVar80._0_12_ = auVar45._0_12_;
          auVar80._12_2_ = auVar45._6_2_;
          auVar80._14_2_ = puVar5[3];
          auVar95._12_4_ = auVar80._12_4_;
          auVar95._0_10_ = auVar45._0_10_;
          auVar95._10_2_ = puVar5[2];
          auVar54._10_6_ = auVar95._10_6_;
          auVar54._0_8_ = auVar45._0_8_;
          auVar54._8_2_ = auVar45._4_2_;
          auVar53._8_8_ = auVar54._8_8_;
          auVar53._6_2_ = puVar5[1];
          auVar53._4_2_ = auVar45._2_2_;
          auVar53._0_2_ = auVar45._0_2_;
          auVar53._2_2_ = *puVar5;
          auVar88 = *(undefined1 (*) [16])(puVar39 + lVar37 * 2 + -0x300);
          puVar6 = (undefined2 *)(puVar39 + lVar37 * 2 + -0x200);
          auVar94._0_12_ = auVar88._0_12_;
          auVar94._12_2_ = auVar88._6_2_;
          auVar94._14_2_ = puVar6[3];
          auVar93._12_4_ = auVar94._12_4_;
          auVar93._0_10_ = auVar88._0_10_;
          auVar93._10_2_ = puVar6[2];
          auVar92._10_6_ = auVar93._10_6_;
          auVar92._0_8_ = auVar88._0_8_;
          auVar92._8_2_ = auVar88._4_2_;
          auVar91._8_8_ = auVar92._8_8_;
          auVar91._6_2_ = puVar6[1];
          auVar91._4_2_ = auVar88._2_2_;
          auVar91._0_2_ = auVar88._0_2_;
          auVar91._2_2_ = *puVar6;
          auVar49 = *(undefined1 (*) [16])(puVar39 + lVar37 * 2 + -0x100);
          puVar2 = (undefined2 *)(puVar39 + lVar37 * 2);
          auVar75 = pmaddwd(auVar71,auVar47);
          auVar55 = pmaddwd(auVar53,auVar48);
          auVar79._0_12_ = auVar49._0_12_;
          auVar79._12_2_ = auVar49._6_2_;
          auVar79._14_2_ = puVar2[3];
          auVar78._12_4_ = auVar79._12_4_;
          auVar78._0_10_ = auVar49._0_10_;
          auVar78._10_2_ = puVar2[2];
          auVar77._10_6_ = auVar78._10_6_;
          auVar77._0_8_ = auVar49._0_8_;
          auVar77._8_2_ = auVar49._4_2_;
          auVar76._8_8_ = auVar77._8_8_;
          auVar76._6_2_ = puVar2[1];
          auVar76._4_2_ = auVar49._2_2_;
          auVar76._0_2_ = auVar49._0_2_;
          auVar76._2_2_ = *puVar2;
          auVar95 = pmaddwd(auVar91,auVar50);
          auVar80 = pmaddwd(auVar76,auVar70);
          auVar81._0_4_ = auVar80._0_4_ + auVar95._0_4_ + auVar55._0_4_ + auVar75._0_4_;
          auVar81._4_4_ = auVar80._4_4_ + auVar95._4_4_ + auVar55._4_4_ + auVar75._4_4_;
          auVar81._8_4_ = auVar80._8_4_ + auVar95._8_4_ + auVar55._8_4_ + auVar75._8_4_;
          auVar81._12_4_ = auVar80._12_4_ + auVar95._12_4_ + auVar55._12_4_ + auVar75._12_4_;
          auVar90._2_2_ = puVar4[4];
          auVar90._0_2_ = auVar44._8_2_;
          auVar90._4_2_ = auVar44._10_2_;
          auVar90._6_2_ = puVar4[5];
          auVar90._8_2_ = auVar44._12_2_;
          auVar90._10_2_ = puVar4[6];
          auVar90._12_2_ = auVar44._14_2_;
          auVar90._14_2_ = puVar4[7];
          auVar75._2_2_ = puVar5[4];
          auVar75._0_2_ = auVar45._8_2_;
          auVar75._4_2_ = auVar45._10_2_;
          auVar75._6_2_ = puVar5[5];
          auVar75._8_2_ = auVar45._12_2_;
          auVar75._10_2_ = puVar5[6];
          auVar75._12_2_ = auVar45._14_2_;
          auVar75._14_2_ = puVar5[7];
          auVar55._2_2_ = puVar6[4];
          auVar55._0_2_ = auVar88._8_2_;
          auVar55._4_2_ = auVar88._10_2_;
          auVar55._6_2_ = puVar6[5];
          auVar55._8_2_ = auVar88._12_2_;
          auVar55._10_2_ = puVar6[6];
          auVar55._12_2_ = auVar88._14_2_;
          auVar55._14_2_ = puVar6[7];
          auVar87._2_2_ = puVar2[4];
          auVar87._0_2_ = auVar49._8_2_;
          auVar87._4_2_ = auVar49._10_2_;
          auVar87._6_2_ = puVar2[5];
          auVar87._8_2_ = auVar49._12_2_;
          auVar87._10_2_ = puVar2[6];
          auVar87._12_2_ = auVar49._14_2_;
          auVar87._14_2_ = puVar2[7];
          auVar49 = pmaddwd(auVar90,auVar47);
          auVar45 = pmaddwd(auVar75,auVar48);
          auVar44 = pmaddwd(auVar55,auVar50);
          auVar88 = pmaddwd(auVar87,auVar70);
          auVar89._0_4_ = auVar88._0_4_ + auVar44._0_4_ + auVar45._0_4_ + auVar49._0_4_;
          auVar89._4_4_ = auVar88._4_4_ + auVar44._4_4_ + auVar45._4_4_ + auVar49._4_4_;
          auVar89._8_4_ = auVar88._8_4_ + auVar44._8_4_ + auVar45._8_4_ + auVar49._8_4_;
          auVar89._12_4_ = auVar88._12_4_ + auVar44._12_4_ + auVar45._12_4_ + auVar49._12_4_;
          auVar56._0_4_ = (auVar81._0_4_ + iVar40 >> auVar46) + iVar35;
          auVar56._4_4_ = (auVar89._0_4_ + iVar40 >> auVar46) + iVar35;
          auVar56._8_4_ = (auVar81._4_4_ + iVar40 >> auVar46) + iVar35;
          auVar56._12_4_ = (auVar89._4_4_ + iVar40 >> auVar46) + iVar35;
          local_8b78 = auVar43._0_2_;
          sStack_8b76 = auVar43._2_2_;
          if (w < 8) {
            if (iVar11 == 0) {
              auVar44 = packusdw(auVar56,auVar56);
              *(long *)(pCVar33 + lVar37) = auVar44._0_8_;
            }
            else {
              auVar44 = pmovzxwd(auVar81,*(undefined8 *)(pCVar33 + lVar37));
              if (iVar12 == 0) {
                iVar52 = auVar56._0_4_ + auVar44._0_4_ >> 1;
                iVar61 = auVar56._4_4_ + auVar44._4_4_ >> 1;
                iVar64 = auVar56._8_4_ + auVar44._8_4_ >> 1;
                iVar67 = auVar56._12_4_ + auVar44._12_4_ >> 1;
              }
              else {
                auVar27._4_4_ = iVar38;
                auVar27._0_4_ = iVar38;
                auVar27._8_4_ = iVar38;
                auVar27._12_4_ = iVar38;
                auVar45 = pmulld(auVar44,auVar27);
                auVar25._4_4_ = iVar9;
                auVar25._0_4_ = iVar9;
                auVar25._8_4_ = iVar9;
                auVar25._12_4_ = iVar9;
                auVar44 = pmulld(auVar56,auVar25);
                iVar52 = auVar44._0_4_ + auVar45._0_4_ >> 4;
                iVar61 = auVar44._4_4_ + auVar45._4_4_ >> 4;
                iVar64 = auVar44._8_4_ + auVar45._8_4_ >> 4;
                iVar67 = auVar44._12_4_ + auVar45._12_4_ >> 4;
              }
              auVar44 = ZEXT416(uVar29);
              auVar57._0_4_ = iVar52 + iVar42 >> auVar44;
              auVar57._4_4_ = iVar61 + iVar42 >> auVar44;
              auVar57._8_4_ = iVar64 + iVar42 >> auVar44;
              auVar57._12_4_ = iVar67 + iVar42 >> auVar44;
              auVar44 = packusdw(auVar57,auVar57);
              sVar51 = auVar44._0_2_;
              sVar59 = auVar44._2_2_;
              sVar60 = auVar44._4_2_;
              sVar62 = auVar44._6_2_;
              *(ulong *)(dst0 + lVar37) =
                   CONCAT26((ushort)(sStack_8b76 < sVar62) * sStack_8b76 |
                            (ushort)(sStack_8b76 >= sVar62) * sVar62,
                            CONCAT24((ushort)(local_8b78 < sVar60) * local_8b78 |
                                     (ushort)(local_8b78 >= sVar60) * sVar60,
                                     CONCAT22((ushort)(sStack_8b76 < sVar59) * sStack_8b76 |
                                              (ushort)(sStack_8b76 >= sVar59) * sVar59,
                                              (ushort)(local_8b78 < sVar51) * local_8b78 |
                                              (ushort)(local_8b78 >= sVar51) * sVar51)));
            }
          }
          else {
            auVar82._0_4_ = (auVar81._8_4_ + iVar40 >> auVar46) + iVar35;
            auVar82._4_4_ = (auVar89._8_4_ + iVar40 >> auVar46) + iVar35;
            auVar82._8_4_ = (auVar81._12_4_ + iVar40 >> auVar46) + iVar35;
            auVar82._12_4_ = (auVar89._12_4_ + iVar40 >> auVar46) + iVar35;
            if (iVar11 == 0) {
              auVar44 = packusdw(auVar56,auVar82);
              *(undefined1 (*) [16])(pCVar33 + lVar37) = auVar44;
            }
            else {
              auVar45 = pmovzxwd(auVar49,*(undefined8 *)(pCVar33 + lVar37));
              auVar44 = pmovzxwd(auVar89,*(undefined8 *)(pCVar33 + lVar37 + 4));
              if (iVar12 == 0) {
                iVar52 = auVar56._0_4_ + auVar45._0_4_ >> 1;
                iVar61 = auVar56._4_4_ + auVar45._4_4_ >> 1;
                iVar64 = auVar56._8_4_ + auVar45._8_4_ >> 1;
                iVar67 = auVar56._12_4_ + auVar45._12_4_ >> 1;
                iVar69 = auVar82._0_4_ + auVar44._0_4_ >> 1;
                iVar84 = auVar82._4_4_ + auVar44._4_4_ >> 1;
                iVar85 = auVar82._8_4_ + auVar44._8_4_ >> 1;
                iVar86 = auVar82._12_4_ + auVar44._12_4_ >> 1;
              }
              else {
                auVar28._4_4_ = iVar38;
                auVar28._0_4_ = iVar38;
                auVar28._8_4_ = iVar38;
                auVar28._12_4_ = iVar38;
                auVar88 = pmulld(auVar45,auVar28);
                auVar26._4_4_ = iVar9;
                auVar26._0_4_ = iVar9;
                auVar26._8_4_ = iVar9;
                auVar26._12_4_ = iVar9;
                auVar45 = pmulld(auVar56,auVar26);
                iVar52 = auVar45._0_4_ + auVar88._0_4_ >> 4;
                iVar61 = auVar45._4_4_ + auVar88._4_4_ >> 4;
                iVar64 = auVar45._8_4_ + auVar88._8_4_ >> 4;
                iVar67 = auVar45._12_4_ + auVar88._12_4_ >> 4;
                auVar45 = pmulld(auVar44,auVar28);
                auVar44 = pmulld(auVar82,auVar26);
                iVar69 = auVar44._0_4_ + auVar45._0_4_ >> 4;
                iVar84 = auVar44._4_4_ + auVar45._4_4_ >> 4;
                iVar85 = auVar44._8_4_ + auVar45._8_4_ >> 4;
                iVar86 = auVar44._12_4_ + auVar45._12_4_ >> 4;
              }
              auVar44 = ZEXT416(uVar29);
              auVar58._0_4_ = iVar52 + iVar42 >> auVar44;
              auVar58._4_4_ = iVar61 + iVar42 >> auVar44;
              auVar58._8_4_ = iVar64 + iVar42 >> auVar44;
              auVar58._12_4_ = iVar67 + iVar42 >> auVar44;
              auVar83._0_4_ = iVar69 + iVar42 >> auVar44;
              auVar83._4_4_ = iVar84 + iVar42 >> auVar44;
              auVar83._8_4_ = iVar85 + iVar42 >> auVar44;
              auVar83._12_4_ = iVar86 + iVar42 >> auVar44;
              auVar44 = packusdw(auVar58,auVar83);
              sVar51 = auVar44._0_2_;
              sVar59 = auVar44._2_2_;
              sVar60 = auVar44._4_2_;
              sVar62 = auVar44._6_2_;
              sVar63 = auVar44._8_2_;
              sVar65 = auVar44._10_2_;
              sVar66 = auVar44._12_2_;
              sVar68 = auVar44._14_2_;
              puVar3 = dst0 + lVar37;
              *puVar3 = (ushort)(local_8b78 < sVar51) * local_8b78 |
                        (ushort)(local_8b78 >= sVar51) * sVar51;
              puVar3[1] = (ushort)(sStack_8b76 < sVar59) * sStack_8b76 |
                          (ushort)(sStack_8b76 >= sVar59) * sVar59;
              puVar3[2] = (ushort)(local_8b78 < sVar60) * local_8b78 |
                          (ushort)(local_8b78 >= sVar60) * sVar60;
              puVar3[3] = (ushort)(sStack_8b76 < sVar62) * sStack_8b76 |
                          (ushort)(sStack_8b76 >= sVar62) * sVar62;
              puVar3[4] = (ushort)(local_8b78 < sVar63) * local_8b78 |
                          (ushort)(local_8b78 >= sVar63) * sVar63;
              puVar3[5] = (ushort)(sStack_8b76 < sVar65) * sStack_8b76 |
                          (ushort)(sStack_8b76 >= sVar65) * sVar65;
              puVar3[6] = (ushort)(local_8b78 < sVar66) * local_8b78 |
                          (ushort)(local_8b78 >= sVar66) * sVar66;
              puVar3[7] = (ushort)(sStack_8b76 < sVar68) * sStack_8b76 |
                          (ushort)(sStack_8b76 >= sVar68) * sVar68;
            }
          }
          lVar37 = lVar37 + 8;
        } while (lVar37 < w);
      }
      uVar41 = uVar41 + 1;
      pCVar33 = pCVar33 + iVar10;
      dst0 = dst0 + dst_stride0;
      puVar39 = puVar39 + 0x100;
    } while (uVar41 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  DECLARE_ALIGNED(16, int16_t,
                  im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = MAX_SB_SIZE;
  int i, j;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  /* Horizontal filter */
  {
    const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_x, subpel_x_qn & SUBPEL_MASK);
    const __m128i coeffs_x = _mm_loadu_si128((__m128i *)x_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

    for (i = 0; i < im_h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        const __m128i data2 =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j + 8]);

        // Filter even-index pixels
        const __m128i res_0 = _mm_madd_epi16(data, coeff_01);
        const __m128i res_2 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 4), coeff_23);
        const __m128i res_4 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 8), coeff_45);
        const __m128i res_6 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 12), coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even =
            _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

        // Filter odd-index pixels
        const __m128i res_1 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 2), coeff_01);
        const __m128i res_3 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 6), coeff_23);
        const __m128i res_5 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 10), coeff_45);
        const __m128i res_7 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 14), coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd =
            _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        _mm_storeu_si128((__m128i *)&im_block[i * im_stride + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_y, subpel_y_qn & SUBPEL_MASK);
    const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_1) >> 1) -
        (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const int16_t *data = &im_block[i * im_stride + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);

        const __m128i res_unsigned_lo =
            _mm_add_epi32(res_lo_round, offset_const);

        if (w < 8) {
          if (do_average) {
            const __m128i data_0 =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));

            const __m128i data_ref_0 = _mm_cvtepu16_epi32(data_0);

            const __m128i comp_avg_res =
                highbd_comp_avg_sse4_1(&data_ref_0, &res_unsigned_lo, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result = highbd_convolve_rounding_sse2(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m128i res_16b =
                _mm_packus_epi32(round_result, round_result);
            const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          } else {
            const __m128i res_16b =
                _mm_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_16b);
          }
        } else {
          const __m128i res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_hi_round, offset_const);

          if (do_average) {
            const __m128i data_lo =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_hi =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j + 4]));

            const __m128i data_ref_0_lo = _mm_cvtepu16_epi32(data_lo);
            const __m128i data_ref_0_hi = _mm_cvtepu16_epi32(data_hi);

            const __m128i comp_avg_res_lo =
                highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi =
                highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_lo =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b =
                _mm_packus_epi32(round_result_lo, round_result_hi);
            const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          } else {
            const __m128i res_16b =
                _mm_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16b);
          }
        }
      }
    }
  }
}